

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O0

void x11_send_init_error(X11Connection *xconn,char *err_message)

{
  int iVar1;
  uint uVar2;
  char *__s;
  size_t sVar3;
  undefined1 *data;
  uchar *reply;
  int msgsize;
  int msglen;
  char *full_message;
  char *err_message_local;
  X11Connection *xconn_local;
  
  __s = dupprintf("%s X11 proxy: %s\n","PSFTP",err_message);
  sVar3 = strlen(__s);
  iVar1 = (int)sVar3;
  data = (undefined1 *)safemalloc((long)(iVar1 + 0xd),1,0);
  uVar2 = iVar1 + 3U & 0xfffffffc;
  *data = 0;
  data[1] = (char)sVar3;
  *(undefined4 *)(data + 2) = *(undefined4 *)(xconn->firstpkt + 2);
  PUT_16BIT_X11(xconn->firstpkt[0],data + 6,(uint16_t)((int)(iVar1 + 3U) >> 2));
  memset(data + 8,0,(long)(int)uVar2);
  memcpy(data + 8,__s,(long)iVar1);
  sshfwd_write(xconn->c,data,(long)(int)(uVar2 + 8));
  sshfwd_write_eof(xconn->c);
  xconn->no_data_sent_to_x_client = false;
  safefree(data);
  safefree(__s);
  return;
}

Assistant:

static void x11_send_init_error(struct X11Connection *xconn,
                                const char *err_message)
{
    char *full_message;
    int msglen, msgsize;
    unsigned char *reply;

    full_message = dupprintf("%s X11 proxy: %s\n", appname, err_message);

    msglen = strlen(full_message);
    reply = snewn(8 + msglen+1 + 4, unsigned char); /* include zero */
    msgsize = (msglen + 3) & ~3;
    reply[0] = 0;              /* failure */
    reply[1] = msglen;         /* length of reason string */
    memcpy(reply + 2, xconn->firstpkt + 2, 4);  /* major/minor proto vsn */
    PUT_16BIT_X11(xconn->firstpkt[0], reply + 6, msgsize >> 2);/* data len */
    memset(reply + 8, 0, msgsize);
    memcpy(reply + 8, full_message, msglen);
    sshfwd_write(xconn->c, reply, 8 + msgsize);
    sshfwd_write_eof(xconn->c);
    xconn->no_data_sent_to_x_client = false;
    sfree(reply);
    sfree(full_message);
}